

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

_Bool upb_Array_Append(upb_Array *arr,upb_MessageValue val,upb_Arena *arena)

{
  _Bool _Var1;
  upb_Arena *arena_local;
  upb_Array *arr_local;
  upb_MessageValue val_local;
  
  _Var1 = upb_Array_IsFrozen(arr);
  if (_Var1) {
    __assert_fail("!upb_Array_IsFrozen(arr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/array.c"
                  ,0x38,"_Bool upb_Array_Append(upb_Array *, upb_MessageValue, upb_Arena *)");
  }
  if (arena == (upb_Arena *)0x0) {
    __assert_fail("arena",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/array.c"
                  ,0x39,"_Bool upb_Array_Append(upb_Array *, upb_MessageValue, upb_Arena *)");
  }
  _Var1 = _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only
                    (arr,arr->size_dont_copy_me__upb_internal_use_only + 1,arena);
  if (_Var1) {
    upb_Array_Set(arr,arr->size_dont_copy_me__upb_internal_use_only - 1,val);
  }
  return _Var1;
}

Assistant:

bool upb_Array_Append(upb_Array* arr, upb_MessageValue val, upb_Arena* arena) {
  UPB_ASSERT(!upb_Array_IsFrozen(arr));
  UPB_ASSERT(arena);
  if (!UPB_PRIVATE(_upb_Array_ResizeUninitialized)(
          arr, arr->UPB_PRIVATE(size) + 1, arena)) {
    return false;
  }
  upb_Array_Set(arr, arr->UPB_PRIVATE(size) - 1, val);
  return true;
}